

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

Matrix * __thiscall Matrix::operator[](Matrix *__return_storage_ptr__,Matrix *this,int i)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  int *sizes;
  ulong uVar5;
  ulong uVar6;
  shared_array<double> local_38;
  
  uVar1 = this->nMatrixDimension;
  uVar6 = 1;
  if ((ulong)uVar1 != 1) {
    uVar6 = (ulong)(uVar1 - 1);
  }
  sizes = (int *)operator_new__(uVar6 * 4);
  *sizes = 1;
  piVar3 = this->pSize;
  for (uVar5 = 1; uVar5 < uVar1; uVar5 = uVar5 + 1) {
    sizes[uVar5 - 1] = piVar3[uVar5];
  }
  local_38.px = (this->matrixParent).px;
  iVar2 = *this->pMult;
  pdVar4 = this->pData;
  local_38.pn.pi_ = (this->matrixParent).pn.pi_;
  if (local_38.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_38.pn.pi_)->use_count_ = (local_38.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  Matrix(__return_storage_ptr__,pdVar4 + (long)i * (long)iVar2,&local_38,sizes,(int)uVar6);
  boost::detail::shared_count::~shared_count(&local_38.pn);
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::operator[](int i)
{
    uint dimension = uint(nMatrixDimension==1 ? 1 : nMatrixDimension-1);
    int *sizes = new int[dimension];
    sizes[0] = 1;
    for (uint s=1; s<uint(nMatrixDimension); s++)
		sizes[s-1] = pSize[s];
    return Matrix( &(pData[i*pMult[0]]), matrixParent, sizes, dimension );
}